

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<float>_>::MultAddScalar
          (TPZTransfer<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TNode *pTVar4;
  uint uVar5;
  complex<float> *pcVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  complex<float> beta_00;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  int in_stack_fffffffffffffdc8;
  TPZFMatrix<std::complex<float>_> xloc;
  TPZFMatrix<std::complex<float>_> zloc;
  TPZFMatrix<std::complex<float>_> aloc;
  
  iVar9 = (int)alpha._M_value;
  if (iVar9 == 0) {
    lVar15 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar15 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  }
  iVar10 = iVar9;
  if (lVar15 != (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow) {
    TPZMatrix<std::complex<float>_>::Error
              ("TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>",(char *)0x0);
  }
  uVar11 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if ((uVar11 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
     (uVar11 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) {
    TPZMatrix<std::complex<float>_>::Error
              ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    uVar11 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  uVar5 = (uint)(this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,z,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar10);
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  uVar8 = uVar11 & 0xffffffff;
  if ((int)uVar11 < 1) {
    uVar8 = 0;
  }
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    if (iVar9 == 0) {
      for (beta._M_value = 0; beta._M_value != uVar5; beta._M_value = beta._M_value + 1) {
        pTVar4 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        iVar10 = pTVar4[beta._M_value].dim;
        lVar15 = (long)iVar10;
        if (((lVar15 != 0) &&
            (lVar13 = (long)(this->fColPosition).fStore[beta._M_value], lVar13 != -1)) &&
           (uVar1 = (this->fNumberofColumnBlocks).fStore[beta._M_value], uVar1 != 0)) {
          beta_00._M_value = beta._M_value;
          pcVar6 = TPZFMatrix<std::complex<float>_>::operator()
                             (z,(long)pTVar4[beta._M_value].pos,uVar11);
          TPZFMatrix<std::complex<float>_>::TPZFMatrix(&xloc,lVar15,1,pcVar6,lVar15);
          uVar14 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar14 = 0;
          }
          while( true ) {
            bVar16 = uVar14 == 0;
            uVar14 = uVar14 - 1;
            if (bVar16) break;
            pTVar4 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            iVar2 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar13];
            iVar3 = pTVar4[iVar2].dim;
            lVar12 = (long)iVar3;
            TPZFMatrix<std::complex<float>_>::TPZFMatrix
                      (&zloc,lVar12,1,
                       x->fElem +
                       (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * uVar11
                       + (long)pTVar4[iVar2].pos,lVar12);
            TPZFMatrix<std::complex<float>_>::TPZFMatrix
                      (&aloc,lVar15,lVar12,
                       (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore +
                       (this->fColumnBlockPosition).super_TPZVec<int>.fStore[lVar13],
                       (long)(iVar10 * iVar3));
            TPZFMatrix<std::complex<float>_>::MultAdd
                      (&aloc,&zloc,&xloc,&xloc,(complex<float>)0x0,beta_00,in_stack_fffffffffffffdc8
                      );
            TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&aloc);
            TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&zloc);
            lVar13 = lVar13 + 1;
          }
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&xloc);
        }
      }
    }
    else {
      for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
        pTVar4 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        iVar10 = pTVar4[uVar14].dim;
        lVar15 = (long)iVar10;
        if (lVar15 != 0) {
          TPZFMatrix<std::complex<float>_>::TPZFMatrix
                    (&xloc,lVar15,1,
                     x->fElem +
                     (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * uVar11 +
                     (long)pTVar4[uVar14].pos,lVar15);
          lVar13 = (long)(this->fColPosition).fStore[uVar14];
          if ((lVar13 != -1) && (uVar1 = (this->fNumberofColumnBlocks).fStore[uVar14], uVar1 != 0))
          {
            uVar7 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar7 = 0;
            }
            while( true ) {
              bVar16 = uVar7 == 0;
              uVar7 = uVar7 - 1;
              if (bVar16) break;
              pTVar4 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
              iVar2 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar13];
              iVar3 = pTVar4[iVar2].dim;
              lVar12 = (long)iVar3;
              pcVar6 = TPZFMatrix<std::complex<float>_>::operator()
                                 (z,(long)pTVar4[iVar2].pos,uVar11);
              TPZFMatrix<std::complex<float>_>::TPZFMatrix(&zloc,lVar12,1,pcVar6,lVar12);
              TPZFMatrix<std::complex<float>_>::TPZFMatrix
                        (&aloc,lVar15,lVar12,
                         (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore +
                         (this->fColumnBlockPosition).super_TPZVec<int>.fStore[lVar13],
                         (long)(iVar10 * iVar3));
              TPZFMatrix<std::complex<float>_>::MultAdd
                        (&aloc,&xloc,&zloc,&zloc,(complex<float>)(alpha._M_value & 0xffffffff),beta,
                         in_stack_fffffffffffffdc8);
              TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&aloc);
              TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&zloc);
              lVar13 = lVar13 + 1;
            }
          }
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&xloc);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAddScalar(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  TVar alpha, TVar beta, int opt) const{
	// multiplies the transfer matrix and puts the result in z
	if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
		this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
		this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
	}
	int rows = fRowBlock.MaxBlockSize();
	int xcols = x.Cols();
	int ic, c, r;
	this->PrepareZ(y,z,beta,opt);
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				TPZFMatrix<TVar> zloc(rowblocksize,1,&z(rowblockpos,ic),rowblocksize);
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> xloc(colblocksize,1,&x.g(colblockpos,ic), colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
				}
			}
		} else {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				TPZFMatrix<TVar> xloc(rowblocksize,1,&x.g(rowblockpos,ic),rowblocksize);
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> zloc(colblocksize,1,&z(colblockpos,ic),colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
					col = rowblockpos-1;
					rowblockpos = col+1;
				}
			}
		}
	}
}